

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::process_restart(jpeg_decoder *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint8 *puVar4;
  byte *pbVar5;
  uint8 uVar6;
  uint8 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  
  uVar10 = 0x601;
  do {
    if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
      uVar8 = this->m_tem_flag;
      this->m_tem_flag = uVar8 ^ 1;
      bVar11 = uVar8 == 0;
    }
    else {
      puVar4 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = puVar4 + 1;
      uVar6 = *puVar4;
      this->m_in_buf_left = this->m_in_buf_left + -1;
      bVar11 = uVar6 == 0xff;
    }
    uVar10 = uVar10 - 1;
    if (bVar11) goto LAB_001214c3;
  } while (1 < uVar10);
  uVar10 = 0;
LAB_001214c3:
  if (uVar10 == 0) {
LAB_001216ea:
    stop_decoding(this,JPGD_BAD_RESTART_MARKER);
  }
  if ((int)uVar10 < 1) {
    bVar11 = false;
    uVar8 = 0;
  }
  else {
    do {
      if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
        uVar1 = this->m_tem_flag;
        this->m_tem_flag = uVar1 ^ 1;
        uVar8 = 0xd9;
        if (uVar1 == 0) {
          uVar8 = 0xff;
        }
      }
      else {
        pbVar5 = this->m_pIn_buf_ofs;
        this->m_pIn_buf_ofs = pbVar5 + 1;
        uVar8 = (uint)*pbVar5;
        this->m_in_buf_left = this->m_in_buf_left + -1;
      }
      if (uVar8 != 0xff) goto LAB_00121549;
      bVar11 = 1 < (int)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar11);
    uVar8 = 0xff;
    uVar10 = 0;
LAB_00121549:
    bVar11 = uVar10 == 0;
  }
  if ((bVar11) || (iVar2 = this->m_next_restart_num, uVar8 != iVar2 + 0xd0U)) goto LAB_001216ea;
  memset(this->m_last_dc_val,0,(long)this->m_comps_in_frame << 2);
  this->m_eob_run = 0;
  this->m_restarts_left = this->m_restart_interval;
  this->m_next_restart_num = iVar2 + 1U & 7;
  this->m_bits_left = 0;
  uVar10 = this->m_bit_buf << 0x10;
  this->m_bit_buf = uVar10;
  if (this->m_in_buf_left < 2) {
LAB_00121609:
    uVar6 = get_octet(this);
    uVar7 = get_octet(this);
    this->m_bit_buf = this->m_bit_buf | (uint)CONCAT11(uVar6,uVar7);
  }
  else {
    puVar4 = this->m_pIn_buf_ofs;
    if ((*puVar4 == 0xff) || (puVar4[1] == 0xff)) goto LAB_00121609;
    this->m_bit_buf = CONCAT11(*puVar4,puVar4[1]) | uVar10;
    this->m_in_buf_left = this->m_in_buf_left + -2;
    this->m_pIn_buf_ofs = puVar4 + 2;
  }
  uVar3 = this->m_bit_buf;
  uVar9 = uVar3 << (-(char)this->m_bits_left & 0x1fU);
  this->m_bit_buf = uVar9;
  if (0 < this->m_bits_left) {
    this->m_bit_buf = uVar9 << 0x10;
    return;
  }
  uVar10 = uVar3 << 0x10;
  this->m_bit_buf = uVar10;
  if (1 < this->m_in_buf_left) {
    puVar4 = this->m_pIn_buf_ofs;
    if ((*puVar4 != 0xff) && (puVar4[1] != 0xff)) {
      this->m_bit_buf = CONCAT11(*puVar4,puVar4[1]) | uVar10;
      this->m_in_buf_left = this->m_in_buf_left + -2;
      this->m_pIn_buf_ofs = puVar4 + 2;
      goto LAB_001216cc;
    }
  }
  uVar6 = get_octet(this);
  uVar7 = get_octet(this);
  this->m_bit_buf = this->m_bit_buf | (uint)CONCAT11(uVar6,uVar7);
LAB_001216cc:
  this->m_bit_buf = this->m_bit_buf << (-(char)this->m_bits_left & 0x1fU);
  this->m_bits_left = this->m_bits_left + 0x10;
  return;
}

Assistant:

void jpeg_decoder::process_restart() {
  int i;
  int c = 0;

  // Align to a byte boundry
  // FIXME: Is this really necessary? get_bits_no_markers() never reads in markers!
  //get_bits_no_markers(m_bits_left & 7);

  // Let's scan a little bit to find the marker, but not _too_ far.
  // 1536 is a "fudge factor" that determines how much to scan.
  for (i = 1536; i > 0; i--)
    if (get_char() == 0xFF)
      break;

  if (i == 0)
    stop_decoding(JPGD_BAD_RESTART_MARKER);

  for (; i > 0; i--)
    if ((c = get_char()) != 0xFF)
      break;

  if (i == 0)
    stop_decoding(JPGD_BAD_RESTART_MARKER);

  // Is it the expected marker? If not, something bad happened.
  if (c != (m_next_restart_num + M_RST0))
    stop_decoding(JPGD_BAD_RESTART_MARKER);

  // Reset each component's DC prediction values.
  memset(&m_last_dc_val, 0, m_comps_in_frame * sizeof(uint));

  m_eob_run = 0;

  m_restarts_left = m_restart_interval;

  m_next_restart_num = (m_next_restart_num + 1) & 7;

  // Get the bit buffer going again...

  m_bits_left = 16;
  get_bits_no_markers(16);
  get_bits_no_markers(16);
}